

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O2

bool __thiscall units::precise_unit::operator==(precise_unit *this,unit *other)

{
  double dVar1;
  bool bVar2;
  double dVar3;
  
  if (other->base_units_ != this->base_units_) {
    return false;
  }
  dVar1 = this->multiplier_;
  dVar3 = (double)other->multiplier_;
  if ((dVar1 == dVar3) && (!NAN(dVar1) && !NAN(dVar3))) {
    return true;
  }
  bVar2 = detail::compare_round_equals((float)dVar1,other->multiplier_);
  return bVar2;
}

Assistant:

constexpr bool equivalent_non_counting(const unit_data& other) const
        {
            return meter_ == other.meter_ && second_ == other.second_ &&
                kilogram_ == other.kilogram_ && ampere_ == other.ampere_ &&
                candela_ == other.candela_ && kelvin_ == other.kelvin_ &&
                currency_ == other.currency_;
        }